

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode AllocateContent(SUNNonlinearSolver NLS,N_Vector y)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 in_RSI;
  long *in_RDI;
  int m;
  SUNContext_conflict sunctx_local_scope_;
  
  iVar1 = *(int *)(*in_RDI + 0x10);
  uVar2 = N_VClone(in_RSI);
  *(undefined8 *)(*in_RDI + 0x68) = uVar2;
  uVar2 = N_VClone(in_RSI);
  *(undefined8 *)(*in_RDI + 0x70) = uVar2;
  uVar2 = N_VClone(in_RSI);
  *(undefined8 *)(*in_RDI + 0x88) = uVar2;
  if (0 < iVar1) {
    uVar2 = N_VClone(in_RSI);
    *(undefined8 *)(*in_RDI + 0x78) = uVar2;
    uVar2 = N_VClone(in_RSI);
    *(undefined8 *)(*in_RDI + 0x80) = uVar2;
    pvVar3 = malloc((long)iVar1 << 2);
    *(void **)(*in_RDI + 0x18) = pvVar3;
    pvVar3 = malloc((long)(iVar1 * iVar1) << 3);
    *(void **)(*in_RDI + 0x30) = pvVar3;
    pvVar3 = malloc((long)iVar1 << 3);
    *(void **)(*in_RDI + 0x38) = pvVar3;
    pvVar3 = malloc((long)((iVar1 + 1) * 2) << 3);
    *(void **)(*in_RDI + 0x40) = pvVar3;
    uVar2 = N_VCloneVectorArray(iVar1,in_RSI);
    *(undefined8 *)(*in_RDI + 0x48) = uVar2;
    uVar2 = N_VCloneVectorArray(iVar1,in_RSI);
    *(undefined8 *)(*in_RDI + 0x50) = uVar2;
    uVar2 = N_VCloneVectorArray(iVar1,in_RSI);
    *(undefined8 *)(*in_RDI + 0x58) = uVar2;
    pvVar3 = malloc((long)((iVar1 + 1) * 2) << 3);
    *(void **)(*in_RDI + 0x60) = pvVar3;
  }
  return 0;
}

Assistant:

static SUNErrCode AllocateContent(SUNNonlinearSolver NLS, N_Vector y)
{
  SUNFunctionBegin(NLS->sunctx);
  int m = FP_CONTENT(NLS)->m;

  FP_CONTENT(NLS)->yprev = N_VClone(y);
  SUNCheckLastErr();

  FP_CONTENT(NLS)->gy = N_VClone(y);
  SUNCheckLastErr();

  FP_CONTENT(NLS)->delta = N_VClone(y);
  SUNCheckLastErr();

  /* Allocate all m-dependent content */
  if (m > 0)
  {
    FP_CONTENT(NLS)->fold = N_VClone(y);
    SUNCheckLastErr();

    FP_CONTENT(NLS)->gold = N_VClone(y);
    SUNCheckLastErr();

    FP_CONTENT(NLS)->imap = (int*)malloc(m * sizeof(int));
    SUNAssert(FP_CONTENT(NLS)->imap, SUN_ERR_MALLOC_FAIL);

    FP_CONTENT(NLS)->R = (sunrealtype*)malloc((m * m) * sizeof(sunrealtype));
    SUNAssert(FP_CONTENT(NLS)->R, SUN_ERR_MALLOC_FAIL);

    FP_CONTENT(NLS)->gamma = (sunrealtype*)malloc(m * sizeof(sunrealtype));
    SUNAssert(FP_CONTENT(NLS)->gamma, SUN_ERR_MALLOC_FAIL);

    FP_CONTENT(NLS)->cvals =
      (sunrealtype*)malloc(2 * (m + 1) * sizeof(sunrealtype));
    SUNAssert(FP_CONTENT(NLS)->cvals, SUN_ERR_MALLOC_FAIL);

    FP_CONTENT(NLS)->df = N_VCloneVectorArray(m, y);
    SUNCheckLastErr();

    FP_CONTENT(NLS)->dg = N_VCloneVectorArray(m, y);
    SUNCheckLastErr();

    FP_CONTENT(NLS)->q = N_VCloneVectorArray(m, y);
    SUNCheckLastErr();

    FP_CONTENT(NLS)->Xvecs = (N_Vector*)malloc(2 * (m + 1) * sizeof(N_Vector));
    SUNAssert(FP_CONTENT(NLS)->Xvecs, SUN_ERR_MALLOC_FAIL);
  }

  return SUN_SUCCESS;
}